

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::writeText(XmlWriter *this,string *text,XmlFormatting fmt)

{
  ostream *os;
  bool bVar1;
  ulong uVar2;
  XmlEncode local_48;
  byte local_1d;
  XmlFormatting local_1c;
  bool tagWasOpen;
  string *psStack_18;
  XmlFormatting fmt_local;
  string *text_local;
  XmlWriter *this_local;
  
  local_1c = fmt;
  psStack_18 = text;
  text_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_1d = this->m_tagIsOpen & 1;
    ensureTagClosed(this);
    if (((local_1d & 1) != 0) && (bVar1 = anon_unknown_1::shouldIndent(local_1c), bVar1)) {
      std::operator<<(this->m_os,(string *)&this->m_indent);
    }
    os = this->m_os;
    XmlEncode::XmlEncode(&local_48,psStack_18,ForTextNodes);
    Catch::operator<<(os,&local_48);
    XmlEncode::~XmlEncode(&local_48);
    applyFormatting(this,local_1c);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeText( std::string const& text, XmlFormatting fmt) {
        if( !text.empty() ){
            bool tagWasOpen = m_tagIsOpen;
            ensureTagClosed();
            if (tagWasOpen && shouldIndent(fmt)) {
                m_os << m_indent;
            }
            m_os << XmlEncode( text );
            applyFormatting(fmt);
        }
        return *this;
    }